

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O0

int oid_parse_number(uint *num,char **p,char *bound)

{
  bool bVar1;
  int local_2c;
  int ret;
  char *bound_local;
  char **p_local;
  uint *num_local;
  
  local_2c = -0x68;
  *num = 0;
  while( true ) {
    bVar1 = false;
    if ((*p < bound) && (bVar1 = false, '/' < **p)) {
      bVar1 = **p < ':';
    }
    if (!bVar1) break;
    local_2c = 0;
    if (0x19999999 < *num) {
      return -0x68;
    }
    *num = *num * 10;
    *num = **p + -0x30 + *num;
    *p = *p + 1;
  }
  return local_2c;
}

Assistant:

static int oid_parse_number(unsigned int *num, const char **p, const char *bound)
{
    int ret = MBEDTLS_ERR_ASN1_INVALID_DATA;

    *num = 0;

    while (*p < bound && **p >= '0' && **p <= '9') {
        ret = 0;
        if (*num > (UINT_MAX / 10)) {
            return MBEDTLS_ERR_ASN1_INVALID_DATA;
        }
        *num *= 10;
        *num += **p - '0';
        (*p)++;
    }
    return ret;
}